

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  undefined8 *puVar1;
  int depth;
  stbi__uint32 x;
  stbi__uint32 y;
  stbi__context *s;
  long lVar2;
  stbi__context *psVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  stbi_uc sVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  stbi_uc **ppsVar16;
  stbi_uc *psVar17;
  size_t sVar18;
  byte *pbVar19;
  int *piVar20;
  bool bVar21;
  char *pcVar22;
  ulong uVar23;
  stbi_uc *psVar24;
  uint uVar25;
  long lVar26;
  uint color;
  long lVar27;
  uint uVar28;
  long lVar29;
  stbi__uint32 raw_len_00;
  stbi_uc *psVar30;
  ulong uVar31;
  int iVar32;
  long *in_FS_OFFSET;
  int local_534;
  stbi_uc tc [3];
  ulong local_4e0;
  stbi__uint32 raw_len;
  ulong local_4c8;
  stbi_uc *local_4c0;
  stbi_uc *local_4b8;
  ulong local_4b0;
  stbi_uc *local_4a8;
  stbi__context *local_4a0;
  size_t local_498;
  int local_490;
  int local_48c;
  stbi__uint32 local_488;
  int local_484;
  ulong local_480;
  size_t local_478;
  long local_470;
  stbi__uint16 tc16 [3];
  stbi_uc palette [1024];
  
  tc[2] = '\0';
  tc[0] = '\0';
  tc[1] = '\0';
  s = z->s;
  z->idata = (stbi_uc *)0x0;
  z->expanded = (stbi_uc *)0x0;
  z->out = (stbi_uc *)0x0;
  iVar11 = stbi__check_png_header(s);
  if (iVar11 == 0) {
    local_534 = 0;
  }
  else {
    local_534 = 1;
    if (scan != 1) {
      ppsVar16 = &z->idata;
      lVar2 = *in_FS_OFFSET;
      puVar1 = (undefined8 *)(lVar2 + -0x20);
      bVar5 = true;
      local_480 = 0;
      color = 0;
      bVar6 = false;
      local_4e0 = 0;
      local_478 = 0;
      local_4c8 = 0;
      bVar7 = false;
      bVar8 = 0;
      do {
        iVar11 = stbi__get16be(s);
        uVar12 = stbi__get16be(s);
        uVar15 = iVar11 * 0x10000 + uVar12;
        uVar13 = stbi__get16be(s);
        uVar14 = stbi__get16be(s);
        uVar25 = uVar13 << 0x10 | uVar14;
        uVar28 = (uint)local_4e0;
        if ((int)uVar25 < 0x49484452) {
          if (uVar25 == 0x43674249) {
            bVar6 = true;
LAB_001be4c2:
            stbi__skip(s,uVar15);
LAB_001be769:
            stbi__get16be(s);
            stbi__get16be(s);
            bVar4 = true;
          }
          else {
            iVar11 = (int)local_4c8;
            if (uVar25 == 0x49444154) {
              if (bVar5) {
LAB_001be59b:
                *puVar1 = "first not IHDR";
                bVar5 = true;
                goto LAB_001be5b4;
              }
              if ((bVar8 != 0) && (uVar28 == 0)) {
                *puVar1 = "no PLTE";
                bVar5 = false;
                local_4e0 = 0;
                goto LAB_001be5b4;
              }
              if (scan == 2) {
                s->img_n = (uint)bVar8;
LAB_001be7d2:
                local_534 = 1;
                bVar5 = false;
                goto LAB_001be7e2;
              }
              uVar12 = uVar15 + iVar11;
              if (iVar11 <= (int)uVar12) {
                if ((uint)local_478 < uVar12) {
                  sVar18 = 0x1000;
                  if (0x1000 < uVar15) {
                    sVar18 = (ulong)uVar15;
                  }
                  if ((uint)local_478 != 0) {
                    sVar18 = local_478 & 0xffffffff;
                  }
                  do {
                    local_478 = sVar18;
                    sVar18 = (ulong)((uint)local_478 * 2);
                  } while ((uint)local_478 < uVar12);
                  psVar17 = (stbi_uc *)realloc(*ppsVar16,local_478);
                  if (psVar17 == (stbi_uc *)0x0) {
                    *puVar1 = "outofmem";
                    bVar5 = false;
                    goto LAB_001be5f1;
                  }
                  *ppsVar16 = psVar17;
                }
                iVar11 = stbi__getn(s,*ppsVar16 + (local_4c8 & 0xffffffff),uVar15);
                if (iVar11 != 0) {
                  local_4c8 = (ulong)uVar12;
                  bVar10 = bVar8;
LAB_001befda:
                  bVar8 = bVar10;
                  bVar5 = false;
                  goto LAB_001be769;
                }
                pcVar22 = "outofdata";
                goto LAB_001be5dc;
              }
LAB_001be5e7:
              bVar5 = false;
              goto LAB_001be5f1;
            }
            if (uVar25 != 0x49454e44) {
LAB_001be4fb:
              if (bVar5) goto LAB_001be59b;
              bVar5 = false;
              if ((uVar13 >> 0xd & 1) == 0) {
                stbi__parse_png_file::invalid_chunk[0] = (char)(uVar25 >> 0x18);
                stbi__parse_png_file::invalid_chunk[1] = (char)(uVar25 >> 0x10);
                stbi__parse_png_file::invalid_chunk[2] = (char)(uVar14 >> 8);
                stbi__parse_png_file::invalid_chunk[3] = (char)uVar14;
                pcVar22 = stbi__parse_png_file::invalid_chunk;
                goto LAB_001be789;
              }
              goto LAB_001be4c2;
            }
            if (bVar5) {
              pcVar22 = "first not IHDR";
LAB_001be40e:
              *puVar1 = pcVar22;
              local_534 = 0;
            }
            else if (scan == 0) {
              if (*ppsVar16 == (stbi_uc *)0x0) {
                pcVar22 = "no IDAT";
                goto LAB_001be40e;
              }
              raw_len = s->img_n * s->img_y * (z->depth * s->img_x + 7 >> 3) + s->img_y;
              psVar17 = (stbi_uc *)
                        stbi_zlib_decode_malloc_guesssize_headerflag
                                  ((char *)*ppsVar16,iVar11,raw_len,(int *)&raw_len,(uint)!bVar6);
              z->expanded = psVar17;
              local_534 = 0;
              if (psVar17 != (stbi_uc *)0x0) {
                free(*ppsVar16);
                raw_len_00 = raw_len;
                *ppsVar16 = (stbi_uc *)0x0;
                iVar11 = s->img_n + 1;
                if (bVar7 || (bVar8 == 0 && req_comp != 3) && iVar11 == req_comp) {
                  s->img_out_n = iVar11;
                }
                else {
                  s->img_out_n = s->img_n;
                }
                psVar17 = z->expanded;
                iVar11 = s->img_out_n;
                depth = z->depth;
                iVar32 = iVar11 << (depth == 0x10);
                x = z->s->img_x;
                y = z->s->img_y;
                if ((int)local_480 == 0) {
                  iVar11 = stbi__create_png_image_raw(z,psVar17,raw_len,iVar11,x,y,depth,color);
                  if (iVar11 != 0) goto LAB_001bee0f;
                }
                else {
                  local_4c0 = (stbi_uc *)stbi__malloc_mad3(x,y,iVar32,0);
                  if (local_4c0 != (stbi_uc *)0x0) {
                    local_498 = (size_t)iVar32;
                    lVar26 = 0;
                    local_490 = iVar32;
                    local_48c = iVar11;
                    do {
                      psVar3 = z->s;
                      local_4b8 = (stbi_uc *)(long)(int)(&DAT_00257cf0)[lVar26];
                      uVar15 = (&DAT_00257d30)[lVar26];
                      uVar28 = ~(&DAT_00257cf0)[lVar26] + psVar3->img_x + uVar15;
                      uVar13 = uVar28 / uVar15;
                      uVar12 = (&DAT_00257d50)[lVar26];
                      uVar25 = ~(&DAT_00257d10)[lVar26] + psVar3->img_y + uVar12;
                      uVar14 = uVar25 / uVar12;
                      bVar21 = true;
                      if ((uVar15 <= uVar28) && (uVar12 <= uVar25)) {
                        local_4a0 = (stbi__context *)
                                    CONCAT44(local_4a0._4_4_,(&DAT_00257d10)[lVar26]);
                        local_484 = uVar13 * depth * psVar3->img_n;
                        local_4a8 = (stbi_uc *)(long)(int)uVar15;
                        local_470 = lVar26;
                        iVar32 = stbi__create_png_image_raw
                                           (z,psVar17,raw_len_00,iVar11,uVar13,uVar14,depth,color);
                        if (iVar32 == 0) {
                          free(local_4c0);
                          bVar21 = false;
                          lVar26 = local_470;
                        }
                        else {
                          local_488 = raw_len_00;
                          if (0 < (int)uVar14) {
                            iVar32 = (int)local_4a0 * local_490;
                            iVar11 = uVar12 * local_490;
                            local_4b8 = local_4c0 + (long)local_4b8 * local_498;
                            lVar26 = (long)local_4a8 * local_498;
                            local_4b0 = 0;
                            sVar18 = local_498;
                            do {
                              if (0 < (int)uVar13) {
                                local_4a0 = z->s;
                                local_4a8 = z->out;
                                lVar29 = local_4b0 * (long)(int)uVar13;
                                lVar27 = 0;
                                psVar30 = local_4b8;
                                do {
                                  memcpy(psVar30 + local_4a0->img_x * iVar32,
                                         local_4a8 + (lVar29 + lVar27) * sVar18,local_498);
                                  lVar27 = lVar27 + 1;
                                  psVar30 = psVar30 + lVar26;
                                  sVar18 = local_498;
                                } while (lVar27 < (int)uVar13);
                              }
                              local_4b0 = local_4b0 + 1;
                              iVar32 = iVar32 + iVar11;
                            } while (local_4b0 < uVar14);
                          }
                          uVar14 = ((local_484 + 7 >> 3) + 1) * uVar14;
                          free(z->out);
                          psVar17 = psVar17 + uVar14;
                          raw_len_00 = local_488 - uVar14;
                          bVar21 = true;
                          lVar26 = local_470;
                          iVar11 = local_48c;
                        }
                      }
                      if (!bVar21) goto LAB_001be7e2;
                      lVar26 = lVar26 + 1;
                    } while (lVar26 != 7);
                    z->out = local_4c0;
LAB_001bee0f:
                    if (bVar7) {
                      if (z->depth == 0x10) {
                        stbi__compute_transparency16(z,tc16,s->img_out_n);
                      }
                      else {
                        stbi__compute_transparency(z,tc,s->img_out_n);
                      }
                    }
                    if (bVar6) {
                      piVar20 = (int *)(lVar2 + -8);
                      if (*(int *)(lVar2 + -4) == 0) {
                        piVar20 = &stbi__de_iphone_flag_global;
                      }
                      if ((*piVar20 != 0) && (2 < s->img_out_n)) {
                        stbi__de_iphone(z);
                      }
                    }
                    if (bVar8 == 0) {
                      if (bVar7) {
                        s->img_n = s->img_n + 1;
                      }
                    }
                    else {
                      s->img_n = (uint)bVar8;
                      uVar15 = (uint)bVar8;
                      if (2 < req_comp) {
                        uVar15 = req_comp;
                      }
                      s->img_out_n = uVar15;
                      psVar17 = z->out;
                      uVar12 = z->s->img_y * z->s->img_x;
                      psVar30 = (stbi_uc *)stbi__malloc_mad2(uVar12,uVar15,0);
                      if (psVar30 == (stbi_uc *)0x0) {
                        *puVar1 = "outofmem";
                      }
                      else {
                        if (uVar15 == 3) {
                          if (uVar12 != 0) {
                            uVar23 = 0;
                            psVar24 = psVar30;
                            do {
                              uVar31 = (ulong)psVar17[uVar23];
                              *psVar24 = palette[uVar31 * 4];
                              psVar24[1] = palette[uVar31 * 4 + 1];
                              psVar24[2] = palette[uVar31 * 4 + 2];
                              psVar24 = psVar24 + 3;
                              uVar23 = uVar23 + 1;
                            } while (uVar12 != uVar23);
                          }
                        }
                        else if (uVar12 != 0) {
                          uVar23 = 0;
                          do {
                            *(undefined4 *)(psVar30 + uVar23 * 4) =
                                 *(undefined4 *)(palette + (ulong)psVar17[uVar23] * 4);
                            uVar23 = uVar23 + 1;
                          } while (uVar12 != uVar23);
                        }
                        free(psVar17);
                        z->out = psVar30;
                      }
                      if (psVar30 == (stbi_uc *)0x0) goto LAB_001be7e2;
                    }
                    free(z->expanded);
                    z->expanded = (stbi_uc *)0x0;
                    stbi__get16be(s);
                    stbi__get16be(s);
                    goto LAB_001be606;
                  }
                  *puVar1 = "outofmem";
                }
              }
            }
            else {
LAB_001be606:
              local_534 = 1;
            }
LAB_001be7e2:
            bVar4 = false;
          }
        }
        else {
          if (uVar25 == 0x74524e53) {
            if (!bVar5) {
              if (*ppsVar16 == (stbi_uc *)0x0) {
                if (bVar8 == 0) {
                  if ((s->img_n & 1U) == 0) {
                    pcVar22 = "tRNS with alpha";
                  }
                  else {
                    if (s->img_n * 2 == uVar15) {
                      bVar7 = true;
                      if (z->depth == 0x10) {
                        if (0 < s->img_n) {
                          lVar26 = 0;
                          do {
                            iVar11 = stbi__get16be(s);
                            tc16[lVar26] = (stbi__uint16)iVar11;
                            lVar26 = lVar26 + 1;
                          } while (lVar26 < s->img_n);
                        }
                      }
                      else if (0 < s->img_n) {
                        lVar26 = 0;
                        do {
                          iVar11 = stbi__get16be(s);
                          tc[lVar26] = ""[z->depth] * (char)iVar11;
                          lVar26 = lVar26 + 1;
                        } while (lVar26 < s->img_n);
                      }
                      bVar5 = false;
                      bVar8 = 0;
                      goto LAB_001be769;
                    }
                    pcVar22 = "bad tRNS len";
                  }
                  *puVar1 = pcVar22;
                  bVar5 = false;
                  bVar8 = 0;
                  goto LAB_001be5b4;
                }
                if (scan == 2) {
                  s->img_n = 4;
                  goto LAB_001be7d2;
                }
                if (uVar28 == 0) {
                  *puVar1 = "tRNS before PLTE";
                  bVar5 = false;
                  local_4e0 = 0;
                  goto LAB_001be5f1;
                }
                if (uVar15 <= uVar28) {
                  bVar8 = 4;
                  bVar5 = false;
                  bVar10 = 4;
                  if (uVar15 == 0) goto LAB_001befda;
                  uVar23 = 0;
                  do {
                    psVar17 = s->img_buffer;
                    if (psVar17 < s->img_buffer_end) {
LAB_001bef1b:
                      s->img_buffer = psVar17 + 1;
                      sVar9 = *psVar17;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar17 = s->img_buffer;
                        goto LAB_001bef1b;
                      }
                      sVar9 = '\0';
                    }
                    palette[uVar23 * 4 + 3] = sVar9;
                    uVar23 = uVar23 + 1;
                  } while (uVar12 + iVar11 * 0x10000 != uVar23);
                  goto LAB_001be769;
                }
                pcVar22 = "bad tRNS len";
              }
              else {
                pcVar22 = "tRNS after IDAT";
              }
LAB_001be5dc:
              *puVar1 = pcVar22;
              goto LAB_001be5e7;
            }
            *puVar1 = "first not IHDR";
            bVar5 = true;
LAB_001be5f1:
            local_534 = 0;
            bVar4 = false;
            goto LAB_001be7e4;
          }
          if (uVar25 == 0x504c5445) {
            if (bVar5) goto LAB_001be59b;
            if (uVar15 < 0x301) {
              uVar23 = (ulong)uVar12 * 0x55555556;
              local_4e0 = uVar23 >> 0x20;
              if ((int)(uVar23 >> 0x20) * 3 == uVar15) {
                bVar5 = false;
                if (2 < uVar12) {
                  uVar31 = 0;
                  do {
                    psVar17 = s->img_buffer;
                    if (psVar17 < s->img_buffer_end) {
LAB_001be690:
                      s->img_buffer = psVar17 + 1;
                      sVar9 = *psVar17;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar17 = s->img_buffer;
                        goto LAB_001be690;
                      }
                      sVar9 = '\0';
                    }
                    palette[uVar31 * 4] = sVar9;
                    psVar17 = s->img_buffer;
                    if (psVar17 < s->img_buffer_end) {
LAB_001be6ca:
                      s->img_buffer = psVar17 + 1;
                      sVar9 = *psVar17;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar17 = s->img_buffer;
                        goto LAB_001be6ca;
                      }
                      sVar9 = '\0';
                    }
                    palette[uVar31 * 4 + 1] = sVar9;
                    psVar17 = s->img_buffer;
                    if (psVar17 < s->img_buffer_end) {
LAB_001be704:
                      s->img_buffer = psVar17 + 1;
                      sVar9 = *psVar17;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        psVar17 = s->img_buffer;
                        goto LAB_001be704;
                      }
                      sVar9 = '\0';
                    }
                    palette[uVar31 * 4 + 2] = sVar9;
                    palette[uVar31 * 4 + 3] = 0xff;
                    uVar31 = uVar31 + 1;
                  } while (uVar23 >> 0x20 != uVar31);
                }
                goto LAB_001be769;
              }
            }
            pcVar22 = "invalid PLTE";
LAB_001be789:
            *puVar1 = pcVar22;
            bVar5 = false;
LAB_001be5b4:
            bVar4 = false;
            local_534 = 0;
            goto LAB_001be7e4;
          }
          if (uVar25 != 0x49484452) goto LAB_001be4fb;
          if (bVar5) {
            if (uVar15 != 0xd) {
              pcVar22 = "bad IHDR len";
              goto LAB_001be74b;
            }
            iVar11 = stbi__get16be(s);
            uVar15 = stbi__get16be(s);
            s->img_x = uVar15 | iVar11 << 0x10;
            iVar11 = stbi__get16be(s);
            uVar15 = stbi__get16be(s);
            uVar15 = uVar15 | iVar11 << 0x10;
            s->img_y = uVar15;
            if ((0x1000000 < uVar15) || (0x1000000 < s->img_x)) {
              pcVar22 = "too large";
              goto LAB_001be74b;
            }
            pbVar19 = s->img_buffer;
            if (pbVar19 < s->img_buffer_end) {
LAB_001be941:
              s->img_buffer = pbVar19 + 1;
              bVar10 = *pbVar19;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar19 = s->img_buffer;
                goto LAB_001be941;
              }
              bVar10 = 0;
            }
            z->depth = (uint)bVar10;
            if ((0x10 < bVar10) || ((0x10116U >> (bVar10 & 0x1f) & 1) == 0)) {
              pcVar22 = "1/2/4/8/16-bit only";
              goto LAB_001be74b;
            }
            pbVar19 = s->img_buffer;
            if (pbVar19 < s->img_buffer_end) {
LAB_001be998:
              s->img_buffer = pbVar19 + 1;
              color = (uint)*pbVar19;
            }
            else {
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                pbVar19 = s->img_buffer;
                goto LAB_001be998;
              }
              color = 0;
            }
            if ((byte)color < 7) {
              if (color != 3) {
                bVar10 = bVar8;
                if ((color & 1) == 0) goto LAB_001bee75;
                goto LAB_001be9b3;
              }
              bVar10 = 3;
              if (z->depth == 0x10) {
                *puVar1 = "bad ctype";
                color = 3;
                goto LAB_001be9c9;
              }
LAB_001bee75:
              bVar8 = bVar10;
              psVar17 = s->img_buffer;
              if (psVar17 < s->img_buffer_end) {
LAB_001beea9:
                s->img_buffer = psVar17 + 1;
                if (*psVar17 == '\0') goto LAB_001bf004;
                pcVar22 = "bad comp method";
LAB_001bf25e:
                *puVar1 = pcVar22;
                bVar21 = false;
                local_534 = 0;
                goto LAB_001be758;
              }
              if (s->read_from_callbacks != 0) {
                stbi__refill_buffer(s);
                psVar17 = s->img_buffer;
                goto LAB_001beea9;
              }
LAB_001bf004:
              sVar9 = stbi__get8(s);
              if (sVar9 != '\0') {
                pcVar22 = "bad filter method";
                goto LAB_001bf25e;
              }
              bVar10 = stbi__get8(s);
              local_480 = (ulong)bVar10;
              if (1 < bVar10) {
                pcVar22 = "bad interlace method";
                goto LAB_001bf25e;
              }
              uVar15 = s->img_x;
              if ((uVar15 == 0) || (uVar12 = s->img_y, uVar12 == 0)) {
                pcVar22 = "0-pixel image";
                goto LAB_001bf25e;
              }
              if (bVar8 == 0) {
                uVar13 = (3 < (byte)color) + 1 + (color & 2);
                s->img_n = uVar13;
                if ((uint)((0x40000000 / (ulong)uVar15) / (ulong)uVar13) < uVar12) {
                  *puVar1 = "too large";
                  bVar8 = 0;
                  goto LAB_001be750;
                }
                if (scan != 2) goto LAB_001bf2e3;
                local_534 = 1;
                bVar21 = false;
                bVar8 = 0;
                goto LAB_001be758;
              }
              s->img_n = 1;
              if (uVar12 <= (uint)(0x40000000 / (ulong)uVar15 >> 2)) {
LAB_001bf2e3:
                bVar21 = true;
                goto LAB_001be758;
              }
              *puVar1 = "too large";
              goto LAB_001be750;
            }
LAB_001be9b3:
            *puVar1 = "bad ctype";
LAB_001be9c9:
            bVar21 = false;
            local_534 = 0;
          }
          else {
            pcVar22 = "multiple IHDR";
LAB_001be74b:
            *puVar1 = pcVar22;
LAB_001be750:
            bVar21 = false;
            local_534 = 0;
          }
LAB_001be758:
          bVar5 = false;
          bVar4 = false;
          if (bVar21) goto LAB_001be769;
        }
LAB_001be7e4:
      } while (bVar4);
    }
  }
  return local_534;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s);
            s->img_y = stbi__get32be(s);
            if (s->img_y > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            if (s->img_x > STBI_MAX_DIMENSIONS) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            // end of PNG chunk, read and skip CRC
            stbi__get32be(s);
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}